

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.h
# Opt level: O2

ssize_t bandit::reporter::summary::write(int __fd,void *__buf,size_t __n)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  int in_ECX;
  int iVar4;
  undefined4 in_register_0000003c;
  int in_R8D;
  long *in_R9;
  const_iterator __end3;
  long *plVar5;
  long *in_stack_00000008;
  long *in_stack_00000010;
  string local_70 [32];
  string local_50 [32];
  
  poVar1 = (ostream *)CONCAT44(in_register_0000003c,__fd);
  iVar4 = (int)__n;
  lVar3 = in_stack_00000008[2];
  if (lVar3 == 0 && (int)__buf == 0) {
    (**(code **)(*in_stack_00000010 + 0x28))(local_50,in_stack_00000010);
    poVar1 = std::operator<<(poVar1,local_50);
    poVar1 = std::operator<<(poVar1,"Could not find any tests.");
    (**(code **)(*in_stack_00000010 + 0x38))(local_70,in_stack_00000010);
    poVar1 = std::operator<<(poVar1,local_70);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(local_70);
    poVar1 = (ostream *)std::__cxx11::string::~string(local_50);
  }
  else {
    if (iVar4 == 0 && lVar3 == 0) {
      (**(code **)(*in_stack_00000010 + 0x10))(local_50,in_stack_00000010);
      poVar2 = std::operator<<(poVar1,local_50);
      poVar2 = std::operator<<(poVar2,"Success!");
      (**(code **)(*in_stack_00000010 + 0x38))(local_70,in_stack_00000010);
      poVar2 = std::operator<<(poVar2,local_70);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      lVar3 = in_stack_00000008[2];
    }
    plVar5 = in_stack_00000008;
    if (lVar3 != 0) {
      while (plVar5 = (long *)*plVar5, plVar5 != in_stack_00000008) {
        poVar2 = std::operator<<(poVar1,(string *)(plVar5 + 2));
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    if (0 < iVar4) {
      (**(code **)(*in_stack_00000010 + 0x28))(local_50,in_stack_00000010);
      poVar2 = std::operator<<(poVar1,local_50);
      poVar2 = std::operator<<(poVar2,"There were failures!");
      (**(code **)(*in_stack_00000010 + 0x38))(local_70,in_stack_00000010);
      poVar2 = std::operator<<(poVar2,local_70);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_50);
      plVar5 = in_R9;
      while (plVar5 = (long *)*plVar5, plVar5 != in_R9) {
        poVar2 = std::operator<<(poVar1,(string *)(plVar5 + 2));
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    poVar2 = std::operator<<(poVar1,"Test run complete. ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)__buf);
    poVar2 = std::operator<<(poVar2," tests run. ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,in_ECX);
    std::operator<<(poVar2," succeeded.");
    if (0 < in_R8D) {
      poVar2 = std::operator<<(poVar1," ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,in_R8D);
      std::operator<<(poVar2," skipped.");
    }
    if (0 < iVar4) {
      poVar2 = std::operator<<(poVar1," ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar4);
      std::operator<<(poVar2," failed.");
    }
    if (in_stack_00000008[2] != 0) {
      poVar2 = std::operator<<(poVar1," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," test run errors.");
    }
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (ssize_t)poVar1;
}

Assistant:

static void write(std::ostream& stm,
          int specs_run, int specs_failed, int specs_succeeded, int specs_skipped,
          const std::list<std::string>& failures, const std::list<std::string>& errors,
          const detail::colorizer_t& colorizer) {
        if (specs_run == 0 && errors.size() == 0) {
          stm << colorizer.bad()
              << "Could not find any tests."
              << colorizer.reset()
              << std::endl;
          return;
        }

        if (specs_failed == 0 && errors.size() == 0) {
          stm << colorizer.good()
              << "Success!"
              << colorizer.reset()
              << std::endl;
        }

        if (errors.size() > 0) {
          for (const auto& error : errors) {
            stm << error << std::endl;
          }
        }

        if (specs_failed > 0) {
          stm << colorizer.bad()
              << "There were failures!"
              << colorizer.reset() << std::endl;
          for (const auto& failure : failures) {
            stm << failure << std::endl;
          }
        }

        stm << "Test run complete. "
            << specs_run << " tests run. "
            << specs_succeeded << " succeeded.";

        if (specs_skipped > 0) {
          stm << " " << specs_skipped << " skipped.";
        }

        if (specs_failed > 0) {
          stm << " " << specs_failed << " failed.";
        }

        if (errors.size() > 0) {
          stm << " " << errors.size() << " test run errors.";
        }

        stm << std::endl;
      }